

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

RelationalKind * __thiscall
matchit::impl::Id<mathiu::impl::RelationalKind>::get(Id<mathiu::impl::RelationalKind> *this)

{
  IdBlock<mathiu::impl::RelationalKind> *pIVar1;
  RelationalKind *pRVar2;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1321:44)>
  local_2;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1189:33)>
  local_1;
  
  pIVar1 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<mathiu::impl::RelationalKind>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>_&>
             ::_S_vtable._M_arr
             [*(__index_type *)
               ((long)&(this->mBlock).
                       super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                       .
                       super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                       .
                       super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                       .
                       super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                       .
                       super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                       .
                       super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
               + 0x18)]._M_data)(&local_2,&this->mBlock);
  pRVar2 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_mathiu::impl::RelationalKind_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>_&>
             ::_S_vtable._M_arr
             [*(__index_type *)
               ((long)&(pIVar1->super_IdBlockBase<mathiu::impl::RelationalKind>).mVariant.
                       super__Variant_base<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>
                       .
                       super__Move_assign_alias<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>
                       .
                       super__Copy_assign_alias<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>
               + 8)]._M_data)(&local_1,&(pIVar1->super_IdBlockBase<mathiu::impl::RelationalKind>).
                                        mVariant);
  return pRVar2;
}

Assistant:

constexpr decltype(auto) get() { return block().get(); }